

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_wav_post_init(ma_wav *pWav)

{
  ma_uint16 mVar1;
  ma_wav *pWav_local;
  
  if (pWav->format == ma_format_unknown) {
    mVar1 = (pWav->dr).translatedFormatTag;
    if (mVar1 == 1) {
      if ((pWav->dr).bitsPerSample == 8) {
        pWav->format = ma_format_u8;
      }
      else if ((pWav->dr).bitsPerSample == 0x10) {
        pWav->format = ma_format_s16;
      }
      else if ((pWav->dr).bitsPerSample == 0x18) {
        pWav->format = ma_format_s24;
      }
      else if ((pWav->dr).bitsPerSample == 0x20) {
        pWav->format = ma_format_s32;
      }
    }
    else if ((mVar1 == 3) && ((pWav->dr).bitsPerSample == 0x20)) {
      pWav->format = ma_format_f32;
    }
    if (pWav->format == ma_format_unknown) {
      pWav->format = ma_format_f32;
    }
  }
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_wav_post_init(ma_wav* pWav)
{
    /*
    If an explicit format was not specified, try picking the closest match based on the internal
    format. The format needs to be supported by miniaudio.
    */
    if (pWav->format == ma_format_unknown) {
        switch (pWav->dr.translatedFormatTag)
        {
            case MA_DR_WAVE_FORMAT_PCM:
            {
                if (pWav->dr.bitsPerSample == 8) {
                    pWav->format = ma_format_u8;
                } else if (pWav->dr.bitsPerSample == 16) {
                    pWav->format = ma_format_s16;
                } else if (pWav->dr.bitsPerSample == 24) {
                    pWav->format = ma_format_s24;
                } else if (pWav->dr.bitsPerSample == 32) {
                    pWav->format = ma_format_s32;
                }
            } break;

            case MA_DR_WAVE_FORMAT_IEEE_FLOAT:
            {
                if (pWav->dr.bitsPerSample == 32) {
                    pWav->format = ma_format_f32;
                }
            } break;

            default: break;
        }

        /* Fall back to f32 if we couldn't find anything. */
        if (pWav->format == ma_format_unknown) {
            pWav->format =  ma_format_f32;
        }
    }

    return MA_SUCCESS;
}